

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::BufferCopyToImage::~BufferCopyToImage(BufferCopyToImage *this)

{
  BufferCopyToImage *this_local;
  
  (this->super_CmdCommand)._vptr_CmdCommand = (_func_int **)&PTR__BufferCopyToImage_01667348;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move(&this->m_memory);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&this->m_dstImage);
  CmdCommand::~CmdCommand(&this->super_CmdCommand);
  return;
}

Assistant:

~BufferCopyToImage	(void) {}